

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_measurement_strings.cpp
# Opt level: O1

void __thiscall
MeasurementToString_caseSensitive_Test::TestBody(MeasurementToString_caseSensitive_Test *this)

{
  unit uVar1;
  long *plVar2;
  _Alloc_hider _Var3;
  int iVar4;
  unit *puVar5;
  uint64_t uVar6;
  precise_measurement *measure;
  unit match_flags;
  long lVar7;
  char *in_R9;
  unit uVar8;
  long lVar9;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar10;
  initializer_list<std::pair<units::unit,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  __l;
  string case_insensitive_plural_str;
  AssertionResult gtest_ar_;
  string plural;
  string singular_caps;
  AssertionResult gtest_ar__6;
  precise_measurement case_insensitive_singular;
  precise_measurement case_insensitive_plural;
  precise_measurement round_trip;
  precise_measurement case_insensitive_singular_caps;
  precise_measurement case_insensitive_plural_caps;
  precise_measurement case_sensitive_singular;
  string plural_caps;
  string singular;
  precise_measurement case_sensitive_plural;
  string local_328;
  pointer local_308;
  undefined1 local_300 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_2f8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2f0;
  unit local_2e0;
  long local_2d8;
  long local_2d0 [2];
  long *local_2c0;
  long local_2b8;
  long local_2b0 [2];
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_2a0;
  AssertHelper local_298;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_290;
  precise_measurement local_288;
  precise_measurement local_270;
  precise_measurement local_258;
  precise_measurement local_240;
  precise_measurement local_228;
  precise_measurement local_210;
  long *local_1f8;
  long local_1f0;
  long local_1e8 [2];
  pair<units::unit,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_1d8;
  pair<units::unit,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_1b0;
  pair<units::unit,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_188;
  pair<units::unit,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_160;
  string local_138;
  string local_118;
  string local_f8;
  string local_d8;
  string local_b8;
  pointer local_98;
  AssertHelper local_90;
  string local_88;
  string local_68;
  precise_measurement local_48;
  
  if (TestBody()::twoc_units_abi_cxx11_ == '\0') {
    iVar4 = __cxa_guard_acquire(&TestBody()::twoc_units_abi_cxx11_);
    if (iVar4 != 0) {
      std::
      pair<units::unit,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::pair<const_char_(&)[3],_true>(&local_1d8,(unit *)&units::lb,(char (*) [3])0x185008);
      std::
      pair<units::unit,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::pair<const_char_(&)[3],_true>(&local_1b0,(unit *)&units::oz,(char (*) [3])0x184a90);
      std::
      pair<units::unit,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::pair<const_char_(&)[3],_true>(&local_188,(unit *)&units::yd,(char (*) [3])0x1838ae);
      local_2e0.multiplier_ = 0.00094635296;
      local_2e0.base_units_ = (unit_data)0x3;
      std::
      pair<units::unit,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::pair<units::unit,_const_char_(&)[3],_true>(&local_160,&local_2e0,(char (*) [3])0x18522a);
      __l._M_len = 4;
      __l._M_array = &local_1d8;
      std::
      vector<std::pair<units::unit,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<units::unit,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::vector(&TestBody()::twoc_units_abi_cxx11_,__l,(allocator_type *)&local_2c0);
      lVar7 = -0xa0;
      paVar10 = &local_160.second.field_2;
      do {
        if (paVar10 !=
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)(&paVar10->_M_allocated_capacity)[-2]) {
          operator_delete((long *)(&paVar10->_M_allocated_capacity)[-2],
                          paVar10->_M_allocated_capacity + 1);
        }
        paVar10 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)(&paVar10->_M_allocated_capacity + -5);
        lVar7 = lVar7 + 0x28;
      } while (lVar7 != 0);
      __cxa_atexit(std::
                   vector<std::pair<units::unit,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<units::unit,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ::~vector,&TestBody()::twoc_units_abi_cxx11_,&__dso_handle);
      __cxa_guard_release(&TestBody()::twoc_units_abi_cxx11_);
    }
  }
  local_98 = TestBody()::twoc_units_abi_cxx11_.
             super__Vector_base<std::pair<units::unit,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<units::unit,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  local_308 = TestBody()::twoc_units_abi_cxx11_.
              super__Vector_base<std::pair<units::unit,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<units::unit,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
  if (TestBody()::twoc_units_abi_cxx11_.
      super__Vector_base<std::pair<units::unit,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<units::unit,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      TestBody()::twoc_units_abi_cxx11_.
      super__Vector_base<std::pair<units::unit,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<units::unit,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    do {
      local_2e0 = (unit)local_2d0;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_2e0,"17 ","");
      puVar5 = (unit *)std::__cxx11::string::_M_append
                                 ((char *)&local_2e0,(ulong)(local_308->second)._M_dataplus._M_p);
      match_flags = (unit)(puVar5 + 2);
      if (*puVar5 == match_flags) {
        local_1d8.second._M_string_length = *(size_type *)match_flags;
        local_1d8.second.field_2._M_allocated_capacity = (size_type)puVar5[3];
        local_1d8.first = (unit)&local_1d8.second._M_string_length;
      }
      else {
        local_1d8.second._M_string_length = *(size_type *)match_flags;
        local_1d8.first = *puVar5;
      }
      local_1d8.second._M_dataplus._M_p = *(pointer *)(puVar5 + 1);
      *puVar5 = match_flags;
      puVar5[1].multiplier_ = 0.0;
      puVar5[1].base_units_ = (unit_data)0x0;
      *(undefined1 *)&puVar5[2].multiplier_ = 0;
      if (local_2e0 != (unit)local_2d0) {
        operator_delete((void *)local_2e0,local_2d0[0] + 1);
      }
      local_2e0 = (unit)local_2d0;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_2e0,local_1d8.first,
                 (long)local_1d8.second._M_dataplus._M_p + (long)local_1d8.first);
      std::__cxx11::string::push_back((char)&local_2e0);
      local_2c0 = local_2b0;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_2c0,local_1d8.first,
                 (long)local_1d8.second._M_dataplus._M_p + (long)local_1d8.first);
      _Var3._M_p = local_1d8.second._M_dataplus._M_p;
      uVar1 = local_1d8.first;
      plVar2 = local_2c0;
      if ((unit)local_1d8.second._M_dataplus._M_p != (unit)0x0) {
        uVar8.multiplier_ = 0.0;
        uVar8.base_units_ = (unit_data)0x0;
        do {
          iVar4 = toupper((int)*(char *)((long)uVar1 + (long)uVar8));
          *(char *)((long)plVar2 + (long)uVar8) = (char)iVar4;
          uVar8 = (unit)((long)uVar8 + 1);
        } while ((unit)_Var3._M_p != uVar8);
      }
      local_1f8 = local_1e8;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_1f8,local_2e0,local_2d8 + (long)local_2e0);
      plVar2 = local_1f8;
      lVar7 = local_2d8;
      uVar1 = local_2e0;
      if (local_2d8 != 0) {
        lVar9 = 0;
        do {
          iVar4 = toupper((int)*(char *)((long)uVar1 + lVar9));
          *(char *)((long)plVar2 + lVar9) = (char)iVar4;
          lVar9 = lVar9 + 1;
        } while (lVar7 != lVar9);
      }
      local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_68,local_2e0,local_2d8 + (long)local_2e0);
      uVar6 = units::getDefaultFlags();
      units::measurement_from_string(&local_48,&local_68,uVar6);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_68._M_dataplus._M_p != &local_68.field_2) {
        operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
      }
      local_300[0] = (internal)
                     ((((uint)(local_308->first).base_units_ ^ (uint)local_48.units_.base_units_) &
                      0xfffffff) == 0);
      local_2f8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      if (!(bool)local_300[0]) {
        testing::Message::Message((Message *)&local_210);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)((long)local_210.value_ + 0x10),"error with ",0xb);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)((long)local_210.value_ + 0x10),(local_308->second)._M_dataplus._M_p,
                   (local_308->second)._M_string_length);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  (&local_328,(internal *)local_300,
                   (AssertionResult *)"case_sensitive_plural.units().has_same_base(up.first)",
                   "false","true",in_R9);
        match_flags.multiplier_ = 2.28412e-43;
        match_flags.base_units_ = (unit_data)0x0;
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&local_270,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_measurement_strings.cpp"
                   ,0xa3,local_328._M_dataplus._M_p);
        testing::internal::AssertHelper::operator=((AssertHelper *)&local_270,(Message *)&local_210)
        ;
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_270);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_328._M_dataplus._M_p != &local_328.field_2) {
          operator_delete(local_328._M_dataplus._M_p,local_328.field_2._M_allocated_capacity + 1);
        }
        if ((long *)local_210.value_ != (long *)0x0) {
          (**(code **)(*(long *)local_210.value_ + 8))();
        }
      }
      if (local_2f8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_2f8,local_2f8);
      }
      local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_88,local_1d8.first,
                 (long)local_1d8.second._M_dataplus._M_p + (long)local_1d8.first);
      uVar6 = units::getDefaultFlags();
      units::measurement_from_string(&local_210,&local_88,uVar6);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_88._M_dataplus._M_p != &local_88.field_2) {
        operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
      }
      local_300[0] = (internal)
                     ((((uint)(local_308->first).base_units_ ^ (uint)local_210.units_.base_units_) &
                      0xfffffff) == 0);
      local_2f8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      if (!(bool)local_300[0]) {
        testing::Message::Message((Message *)&local_270);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  (&local_328,(internal *)local_300,
                   (AssertionResult *)"case_sensitive_singular.units().has_same_base(up.first)",
                   "false","true",in_R9);
        match_flags.multiplier_ = 2.34017e-43;
        match_flags.base_units_ = (unit_data)0x0;
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&local_288,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_measurement_strings.cpp"
                   ,0xa7,local_328._M_dataplus._M_p);
        testing::internal::AssertHelper::operator=((AssertHelper *)&local_288,(Message *)&local_270)
        ;
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_288);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_328._M_dataplus._M_p != &local_328.field_2) {
          operator_delete(local_328._M_dataplus._M_p,local_328.field_2._M_allocated_capacity + 1);
        }
        if ((long *)local_270.value_ != (long *)0x0) {
          (**(code **)(*(long *)local_270.value_ + 8))();
        }
      }
      if (local_2f8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_2f8,local_2f8);
      }
      local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_b8,local_2e0,local_2d8 + (long)local_2e0);
      units::measurement_from_string(&local_270,&local_b8,0x200);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
        operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
      }
      local_300[0] = (internal)
                     ((((uint)(local_308->first).base_units_ ^ (uint)local_270.units_.base_units_) &
                      0xfffffff) == 0);
      local_2f8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      if (!(bool)local_300[0]) {
        testing::Message::Message((Message *)&local_288);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)((long)local_288.value_ + 0x10),(local_308->second)._M_dataplus._M_p,
                   (local_308->second)._M_string_length);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  (&local_328,(internal *)local_300,
                   (AssertionResult *)"case_insensitive_plural.units().has_same_base(up.first)",
                   "false","true",in_R9);
        match_flags.multiplier_ = 2.42425e-43;
        match_flags.base_units_ = (unit_data)0x0;
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&local_228,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_measurement_strings.cpp"
                   ,0xad,local_328._M_dataplus._M_p);
        testing::internal::AssertHelper::operator=((AssertHelper *)&local_228,(Message *)&local_288)
        ;
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_228);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_328._M_dataplus._M_p != &local_328.field_2) {
          operator_delete(local_328._M_dataplus._M_p,local_328.field_2._M_allocated_capacity + 1);
        }
        if ((long *)local_288.value_ != (long *)0x0) {
          (**(code **)(*(long *)local_288.value_ + 8))();
        }
      }
      if (local_2f8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_2f8,local_2f8);
      }
      local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_d8,local_1d8.first,
                 (long)local_1d8.second._M_dataplus._M_p + (long)local_1d8.first);
      units::measurement_from_string(&local_288,&local_d8,0x200);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
        operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
      }
      local_300[0] = (internal)
                     ((((uint)(local_308->first).base_units_ ^ (uint)local_288.units_.base_units_) &
                      0xfffffff) == 0);
      local_2f8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      if (!(bool)local_300[0]) {
        testing::Message::Message((Message *)&local_228);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  (&local_328,(internal *)local_300,
                   (AssertionResult *)"case_insensitive_singular.units().has_same_base(up.first)",
                   "false","true",in_R9);
        match_flags.multiplier_ = 2.50832e-43;
        match_flags.base_units_ = (unit_data)0x0;
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&local_240,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_measurement_strings.cpp"
                   ,0xb3,local_328._M_dataplus._M_p);
        testing::internal::AssertHelper::operator=((AssertHelper *)&local_240,(Message *)&local_228)
        ;
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_240);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_328._M_dataplus._M_p != &local_328.field_2) {
          operator_delete(local_328._M_dataplus._M_p,local_328.field_2._M_allocated_capacity + 1);
        }
        if ((long *)local_228.value_ != (long *)0x0) {
          (**(code **)(*(long *)local_228.value_ + 8))();
        }
      }
      if (local_2f8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_2f8,local_2f8);
      }
      local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_f8,local_1f8,local_1f0 + (long)local_1f8);
      units::measurement_from_string(&local_228,&local_f8,0x200);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
        operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
      }
      local_300[0] = (internal)
                     ((((uint)(local_308->first).base_units_ ^ (uint)local_228.units_.base_units_) &
                      0xfffffff) == 0);
      local_2f8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      if (!(bool)local_300[0]) {
        testing::Message::Message((Message *)&local_240);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  (&local_328,(internal *)local_300,
                   (AssertionResult *)"case_insensitive_plural_caps.units().has_same_base(up.first)"
                   ,"false","true",in_R9);
        match_flags.multiplier_ = 2.60642e-43;
        match_flags.base_units_ = (unit_data)0x0;
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&local_258,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_measurement_strings.cpp"
                   ,0xba,local_328._M_dataplus._M_p);
        testing::internal::AssertHelper::operator=((AssertHelper *)&local_258,(Message *)&local_240)
        ;
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_258);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_328._M_dataplus._M_p != &local_328.field_2) {
          operator_delete(local_328._M_dataplus._M_p,local_328.field_2._M_allocated_capacity + 1);
        }
        if ((long *)local_240.value_ != (long *)0x0) {
          (**(code **)(*(long *)local_240.value_ + 8))();
        }
      }
      if (local_2f8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_2f8,local_2f8);
      }
      local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_118,local_2c0,local_2b8 + (long)local_2c0);
      units::measurement_from_string(&local_240,&local_118,0x200);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_118._M_dataplus._M_p != &local_118.field_2) {
        operator_delete(local_118._M_dataplus._M_p,local_118.field_2._M_allocated_capacity + 1);
      }
      local_300[0] = (internal)
                     ((((uint)(local_308->first).base_units_ ^ (uint)local_240.units_.base_units_) &
                      0xfffffff) == 0);
      local_2f8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      if (!(bool)local_300[0]) {
        testing::Message::Message((Message *)&local_258);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  (&local_328,(internal *)local_300,
                   (AssertionResult *)
                   "case_insensitive_singular_caps.units().has_same_base(up.first)","false","true",
                   in_R9);
        match_flags.multiplier_ = 2.69049e-43;
        match_flags.base_units_ = (unit_data)0x0;
        testing::internal::AssertHelper::AssertHelper
                  (&local_298,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_measurement_strings.cpp"
                   ,0xc0,local_328._M_dataplus._M_p);
        testing::internal::AssertHelper::operator=(&local_298,(Message *)&local_258);
        testing::internal::AssertHelper::~AssertHelper(&local_298);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_328._M_dataplus._M_p != &local_328.field_2) {
          operator_delete(local_328._M_dataplus._M_p,local_328.field_2._M_allocated_capacity + 1);
        }
        if ((long *)local_258.value_ != (long *)0x0) {
          (**(code **)(*(long *)local_258.value_ + 8))();
        }
      }
      if (local_2f8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_2f8,local_2f8);
      }
      measure = (precise_measurement *)units::getDefaultFlags();
      units::to_string_abi_cxx11_(&local_328,(units *)&local_270,measure,(uint64_t)match_flags);
      local_138._M_dataplus._M_p = (pointer)&local_138.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_138,local_328._M_dataplus._M_p,
                 local_328._M_dataplus._M_p + local_328._M_string_length);
      units::measurement_from_string(&local_258,&local_138,0x200);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_138._M_dataplus._M_p != &local_138.field_2) {
        operator_delete(local_138._M_dataplus._M_p,local_138.field_2._M_allocated_capacity + 1);
      }
      local_298.data_._0_1_ =
           (internal)
           ((((uint)(local_308->first).base_units_ ^ (uint)local_258.units_.base_units_) & 0xfffffff
            ) == 0);
      local_290 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      if (!(bool)local_298.data_._0_1_) {
        testing::Message::Message((Message *)&local_2a0);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)local_300,(internal *)&local_298,
                   (AssertionResult *)"round_trip.units().has_same_base(up.first)","false","true",
                   in_R9);
        testing::internal::AssertHelper::AssertHelper
                  (&local_90,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_measurement_strings.cpp"
                   ,199,(char *)CONCAT71(local_300._1_7_,local_300[0]));
        testing::internal::AssertHelper::operator=(&local_90,(Message *)&local_2a0);
        testing::internal::AssertHelper::~AssertHelper(&local_90);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)CONCAT71(local_300._1_7_,local_300[0]) != &local_2f0) {
          operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)CONCAT71(local_300._1_7_,local_300[0]),
                          local_2f0._M_allocated_capacity + 1);
        }
        if (local_2a0._M_head_impl !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          (**(code **)(*(long *)local_2a0._M_head_impl + 8))();
        }
      }
      if (local_290 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_290,local_290);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_328._M_dataplus._M_p != &local_328.field_2) {
        operator_delete(local_328._M_dataplus._M_p,local_328.field_2._M_allocated_capacity + 1);
      }
      if (local_1f8 != local_1e8) {
        operator_delete(local_1f8,local_1e8[0] + 1);
      }
      if (local_2c0 != local_2b0) {
        operator_delete(local_2c0,local_2b0[0] + 1);
      }
      if (local_2e0 != (unit)local_2d0) {
        operator_delete((void *)local_2e0,local_2d0[0] + 1);
      }
      if (local_1d8.first != (unit)&local_1d8.second._M_string_length) {
        operator_delete((void *)local_1d8.first,local_1d8.second._M_string_length + 1);
      }
      local_308 = local_308 + 1;
    } while (local_308 != local_98);
  }
  return;
}

Assistant:

TEST(MeasurementToString, caseSensitive)
{
    static const std::vector<std::pair<unit, std::string>> twoc_units{
        {lb, "lb"},
        {oz, "oz"},
        {yd, "yd"},
        {unit_cast(precise::us::quart), "qt"}};

    for (const auto& up : twoc_units) {
        std::string singular = std::string("17 ") + up.second;
        std::string plural = singular;
        plural.push_back('s');

        std::string singular_caps = singular;
        std::transform(
            singular.begin(), singular.end(), singular_caps.begin(), ::toupper);

        std::string plural_caps = plural;
        std::transform(
            plural.begin(), plural.end(), plural_caps.begin(), ::toupper);

        precise_measurement case_sensitive_plural =
            measurement_from_string(plural);
        // true
        EXPECT_TRUE(case_sensitive_plural.units().has_same_base(up.first))
            << "error with " << up.second;
        precise_measurement case_sensitive_singular =
            measurement_from_string(singular);
        EXPECT_TRUE(case_sensitive_singular.units().has_same_base(up.first));

        // Case insensitive string conversion
        precise_measurement case_insensitive_plural =
            measurement_from_string(plural, case_insensitive);
        // true
        EXPECT_TRUE(case_insensitive_plural.units().has_same_base(up.first))
            << up.second;

        units::precise_measurement case_insensitive_singular =
            measurement_from_string(singular, case_insensitive);
        // false
        EXPECT_TRUE(case_insensitive_singular.units().has_same_base(up.first));

        // Case insensitive string conversion caps
        precise_measurement case_insensitive_plural_caps =
            measurement_from_string(plural_caps, case_insensitive);
        // true
        EXPECT_TRUE(
            case_insensitive_plural_caps.units().has_same_base(up.first));

        units::precise_measurement case_insensitive_singular_caps =
            measurement_from_string(singular_caps, case_insensitive);
        // false
        EXPECT_TRUE(
            case_insensitive_singular_caps.units().has_same_base(up.first));

        // Round trip
        const std::string case_insensitive_plural_str =
            units::to_string(case_insensitive_plural);
        units::precise_measurement round_trip = units::measurement_from_string(
            case_insensitive_plural_str, units::case_insensitive);
        EXPECT_TRUE(round_trip.units().has_same_base(up.first));
    }
}